

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

Orphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_> *
__thiscall
capnp::compiler::Compiler::getFileImportTable
          (Orphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_>
           *__return_storage_ptr__,Compiler *this,Module *module,Orphanage orphanage)

{
  CompiledModule *this_00;
  
  kj::_::Mutex::lock(&(this->impl).mutex,EXCLUSIVE);
  this_00 = Impl::addInternal((this->impl).value.ptr,module);
  CompiledModule::getFileImportTable(__return_storage_ptr__,this_00,orphanage);
  kj::_::Mutex::unlock(&(this->impl).mutex,EXCLUSIVE);
  return __return_storage_ptr__;
}

Assistant:

Orphan<List<schema::CodeGeneratorRequest::RequestedFile::Import>>
    Compiler::getFileImportTable(Module& module, Orphanage orphanage) const {
  return impl.lockExclusive()->get()->getFileImportTable(module, orphanage);
}